

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<unsigned_long,double>
          (Thread *this,BinopFunc<unsigned_long,_double> *f)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  Simd<unsigned_long,_(unsigned_char)__x02_> value;
  Simd<double,_(unsigned_char)__x02_> SVar3;
  Simd<double,_(unsigned_char)__x02_> SVar4;
  double local_28;
  double local_20;
  
  SVar3 = Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  SVar4 = Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  local_28 = SVar3.v[0];
  uVar1 = (*f)(SVar4.v[0],local_28);
  local_20 = SVar3.v[1];
  uVar2 = (*f)(SVar4.v[1],local_20);
  value.v[1] = uVar2;
  value.v[0] = uVar1;
  Push<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}